

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O3

bool __thiscall FConfigFile::WriteConfigFile(FConfigFile *this)

{
  FConfigSection *pFVar1;
  char *pcVar2;
  bool bVar3;
  FILE *__stream;
  char *pcVar4;
  FConfigEntry *pFVar5;
  
  if ((this->OkayToWrite != false) || (bVar3 = true, this->FileExisted == false)) {
    __stream = fopen((this->PathName).Chars,"w");
    if (__stream == (FILE *)0x0) {
      bVar3 = false;
    }
    else {
      (*this->_vptr_FConfigFile[2])(this,__stream);
      pFVar1 = this->Sections;
      while (pFVar1 != (FConfigSection *)0x0) {
        pFVar5 = pFVar1->RootEntry;
        pcVar2 = (pFVar1->Note).Chars;
        if (*(int *)(pcVar2 + -0xc) != 0) {
          fputs(pcVar2,__stream);
        }
        fprintf(__stream,"[%s]\n",(pFVar1->SectionName).Chars);
        for (; pFVar5 != (FConfigEntry *)0x0; pFVar5 = pFVar5->Next) {
          pcVar2 = pFVar5->Value;
          pcVar4 = strpbrk(pcVar2,"\r\n");
          if (pcVar4 == (char *)0x0) {
            fprintf(__stream,"%s=%s\n",pFVar5->Key,pcVar2);
          }
          else {
            GenerateEndTag(pcVar2);
            fprintf(__stream,"%s=<<<%s\n%s\n>>>%s\n",pFVar5->Key,GenerateEndTag::EndTag,
                    pFVar5->Value,GenerateEndTag::EndTag);
          }
        }
        pFVar1 = pFVar1->Next;
        fputs("\n",__stream);
      }
      fclose(__stream);
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool FConfigFile::WriteConfigFile () const
{
	if (!OkayToWrite && FileExisted)
	{ // Pretend it was written anyway so that the user doesn't get
	  // any "config not written" notifications, but only if the file
	  // already existed. Otherwise, let it write out a default one.
		return true;
	}

	FILE *file = fopen (PathName, "w");
	FConfigSection *section;
	FConfigEntry *entry;

	if (file == NULL)
		return false;

	WriteCommentHeader (file);

	section = Sections;
	while (section != NULL)
	{
		entry = section->RootEntry;
		if (section->Note.IsNotEmpty())
		{
			fputs (section->Note.GetChars(), file);
		}
		fprintf (file, "[%s]\n", section->SectionName.GetChars());
		while (entry != NULL)
		{
			if (strpbrk(entry->Value, "\r\n") == NULL)
			{ // Single-line value
				fprintf (file, "%s=%s\n", entry->Key, entry->Value);
			}
			else
			{ // Multi-line value
				const char *endtag = GenerateEndTag(entry->Value);
				fprintf (file, "%s=<<<%s\n%s\n>>>%s\n", entry->Key,
					endtag, entry->Value, endtag);
			}
			entry = entry->Next;
		}
		section = section->Next;
		fputs ("\n", file);
	}
	fclose (file);
	return true;
}